

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::Block::
set_empty<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::InnerQueueContext)0>
          (Block *this,index_t i)

{
  long lVar1;
  Block *pBVar2;
  __int_type prevVal;
  index_t i_local;
  Block *this_local;
  
  pBVar2 = this + 0x808;
  LOCK();
  lVar1 = *(long *)pBVar2;
  *(long *)pBVar2 = *(long *)pBVar2 + 1;
  UNLOCK();
  return lVar1 == 0xff;
}

Assistant:

inline bool set_empty(index_t i)
		{
			if (context == explicit_context && BLOCK_SIZE <= EXPLICIT_BLOCK_EMPTY_COUNTER_THRESHOLD) {
				// Set flag
				assert(!emptyFlags[BLOCK_SIZE - 1 - static_cast<size_t>(i & static_cast<index_t>(BLOCK_SIZE - 1))].load(std::memory_order_relaxed));
				emptyFlags[BLOCK_SIZE - 1 - static_cast<size_t>(i & static_cast<index_t>(BLOCK_SIZE - 1))].store(true, std::memory_order_release);
				return false;
			}
			else {
				// Increment counter
				auto prevVal = elementsCompletelyDequeued.fetch_add(1, std::memory_order_release);
				assert(prevVal < BLOCK_SIZE);
				return prevVal == BLOCK_SIZE - 1;
			}
		}